

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gest_matrix.cpp
# Opt level: O0

Matrix InputMatrix(istream *f)

{
  istream *this;
  void *this_00;
  int local_34;
  int local_30;
  int ncols;
  int nrows;
  int iStack_24;
  char check;
  int j;
  int i;
  Matrix m;
  istream *f_local;
  
  m = (Matrix)f;
  this = std::operator>>(f,(char *)((long)&ncols + 3));
  this_00 = (void *)std::istream::operator>>(this,&local_30);
  std::istream::operator>>(this_00,&local_34);
  if (ncols._3_1_ == 'M') {
    _j = (istream *)NewMatrix(local_30,local_34);
    for (iStack_24 = 0; iStack_24 < local_30; iStack_24 = iStack_24 + 1) {
      for (nrows = 0; nrows < local_34; nrows = nrows + 1) {
        std::istream::operator>>
                  (m,(double *)(*(long *)(_j + (long)iStack_24 * 8) + (long)nrows * 8));
      }
    }
    f_local = _j;
  }
  else {
    std::ios::clear((int)m + SUB84((*m)[-3],0));
    f_local = (istream *)0x0;
  }
  return (Matrix)f_local;
}

Assistant:

Matrix
InputMatrix(std::istream &f)
{
  Matrix m;
  int i, j;
  char check;
  int nrows, ncols;

  f >> check >> nrows >> ncols;
  if (check != 'M') {
    f.clear(std::ios::badbit);
    return nullptr;
  }
  m = NewMatrix(nrows, ncols);
  for (i = 0; i < nrows; i++)
    for (j = 0; j < ncols; j++)
      f >> m[i][j];
  return m;
}